

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

size_t ChunkListDiskSize(WebPChunk *chunk_list)

{
  size_t sVar1;
  long in_RDI;
  size_t size;
  WebPChunk *chunk;
  long local_8;
  
  chunk = (WebPChunk *)0x0;
  for (local_8 = in_RDI; local_8 != 0; local_8 = *(long *)(local_8 + 0x18)) {
    sVar1 = ChunkDiskSize(chunk);
    chunk = (WebPChunk *)((long)&chunk->tag_ + sVar1);
  }
  return (size_t)chunk;
}

Assistant:

size_t ChunkListDiskSize(const WebPChunk* chunk_list) {
  size_t size = 0;
  while (chunk_list != NULL) {
    size += ChunkDiskSize(chunk_list);
    chunk_list = chunk_list->next_;
  }
  return size;
}